

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O0

void wasm::
     CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
     ::doStartTry(RedundantSetElimination *self,Expression **currp)

{
  Try *local_28;
  Try *local_20;
  Try *curr;
  Expression **currp_local;
  RedundantSetElimination *self_local;
  
  curr = (Try *)currp;
  currp_local = (Expression **)self;
  local_20 = Expression::cast<wasm::Try>(*currp);
  std::
  vector<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>_>_>
  ::emplace_back<>((vector<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>_>_>
                    *)(currp_local + 0x3e));
  local_28 = local_20;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)(currp_local + 0x41)
             ,(value_type *)&local_28);
  return;
}

Assistant:

static void doStartTry(SubType* self, Expression** currp) {
    auto* curr = (*currp)->cast<Try>();
    self->throwingInstsStack.emplace_back();
    self->tryStack.push_back(curr);
  }